

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi.cpp
# Opt level: O2

MPP_RET mpi_enqueue(MppCtx ctx,MppPortType type,MppTask task)

{
  MPP_RET MVar1;
  
  if (((byte)mpi_debug & 1) != 0) {
    _mpp_log_l(4,"mpi","enter ctx %p type %d task %p\n","mpi_enqueue",ctx,type,task);
  }
  MVar1 = _check_mpp_ctx((MpiImpl *)ctx,"mpi_enqueue");
  if (MVar1 == MPP_OK) {
    if ((int)type < 2 && task != (MppTask)0x0) {
      MVar1 = Mpp::enqueue(*(Mpp **)((long)ctx + 0x18),type,task);
    }
    else {
      _mpp_log_l(2,"mpi","invalid input type %d task %p\n","mpi_enqueue",type,task);
      MVar1 = MPP_ERR_UNKNOW;
    }
  }
  if (((byte)mpi_debug & 1) != 0) {
    _mpp_log_l(4,"mpi","leave ctx %p ret %d\n","mpi_enqueue",ctx,(ulong)(uint)MVar1);
  }
  return MVar1;
}

Assistant:

static MPP_RET mpi_enqueue(MppCtx ctx, MppPortType type, MppTask task)
{
    MPP_RET ret = MPP_NOK;
    MpiImpl *p = (MpiImpl *)ctx;

    mpi_dbg_func("enter ctx %p type %d task %p\n", ctx, type, task);
    do {
        ret = check_mpp_ctx(p);
        if (ret)
            break;;

        if (type >= MPP_PORT_BUTT || NULL == task) {
            mpp_err_f("invalid input type %d task %p\n", type, task);
            ret = MPP_ERR_UNKNOW;
            break;
        }

        ret = p->ctx->enqueue(type, task);
    } while (0);

    mpi_dbg_func("leave ctx %p ret %d\n", ctx, ret);
    return ret;
}